

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::Skip(EpsCopyOutputStream *this,int count,uint8 **pp)

{
  uint uVar1;
  uint8 *puVar2;
  long *in_RDX;
  int in_ESI;
  EpsCopyOutputStream *in_RDI;
  void *data;
  int size;
  uint8 *in_stack_000000e0;
  EpsCopyOutputStream *in_stack_000000e8;
  uint8 *local_30;
  int local_24;
  long *local_20;
  int local_14;
  
  if (-1 < in_ESI) {
    if ((in_RDI->had_error_ & 1U) == 0) {
      local_20 = in_RDX;
      local_14 = in_ESI;
      local_24 = Flush(in_stack_000000e8,in_stack_000000e0);
      if ((in_RDI->had_error_ & 1U) == 0) {
        local_30 = in_RDI->buffer_end_;
        do {
          if (local_14 <= local_24) {
            puVar2 = SetInitialBuffer(in_RDI,local_30 + local_14,local_24 - local_14);
            *local_20 = (long)puVar2;
            return true;
          }
          local_14 = local_14 - local_24;
          uVar1 = (*in_RDI->stream_->_vptr_ZeroCopyOutputStream[2])
                            (in_RDI->stream_,&local_30,&local_24);
        } while ((uVar1 & 1) != 0);
        puVar2 = Error(in_RDI);
        *local_20 = (long)puVar2;
      }
      else {
        *local_20 = (long)in_RDI->buffer_;
      }
    }
    else {
      *in_RDX = (long)in_RDI->buffer_;
    }
  }
  return false;
}

Assistant:

bool EpsCopyOutputStream::Skip(int count, uint8** pp) {
  if (count < 0) return false;
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  int size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  void* data = buffer_end_;
  while (count > size) {
    count -= size;
    if (!stream_->Next(&data, &size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(static_cast<uint8*>(data) + count, size - count);
  return true;
}